

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveData.cpp
# Opt level: O0

void __thiscall CDirectiveData::writeTempData(CDirectiveData *this,TempData *tempData)

{
  size_t sVar1;
  bool bVar2;
  long local_c8;
  wstring local_c0 [36];
  undefined4 local_9c;
  long local_98;
  wstring local_90 [32];
  ulong local_70;
  size_t i_1;
  size_t len;
  uchar *Data;
  size_t i;
  wstring local_40 [8];
  wstring result;
  int local_1c;
  TempData *pTStack_18;
  int num;
  TempData *tempData_local;
  CDirectiveData *this_local;
  
  pTStack_18 = tempData;
  tempData_local = (TempData *)this;
  std::__cxx11::wstring::wstring(local_40);
  sVar1 = this->UnitSize;
  if (sVar1 == 1) {
    std::__cxx11::wstring::operator=(local_40,L".byte ");
  }
  else if (sVar1 == 2) {
    std::__cxx11::wstring::operator=(local_40,L".halfword ");
  }
  else if (sVar1 == 4) {
    std::__cxx11::wstring::operator=(local_40,L".word ");
  }
  Data = (uchar *)0x0;
  do {
    if ((uchar *)this->TotalAmount <= Data) {
      std::__cxx11::wstring::pop_back();
      TempData::writeLine(pTStack_18,this->RamPos,(wstring *)local_40);
      local_9c = 0;
LAB_0019c29e:
      std::__cxx11::wstring::~wstring(local_40);
      return;
    }
    if ((this->Entries[(long)Data].String & 1U) == 1) {
      len = (size_t)CByteList::GetEntry(&this->StrData,this->Entries[(long)Data].num);
      i_1 = CByteList::GetLen(&this->StrData,this->Entries[(long)Data].num);
      for (local_70 = 0; local_70 < i_1; local_70 = local_70 + 1) {
        local_98 = this->UnitSize * 2;
        formatString<unsigned_long,unsigned_char>
                  ((wchar_t *)local_90,(unsigned_long *)L"0x%0*X,",(uchar *)&local_98);
        std::__cxx11::wstring::operator+=(local_40,local_90);
        std::__cxx11::wstring::~wstring(local_90);
      }
    }
    else {
      bVar2 = evalExpression(this->ExpData + this->Entries[(long)Data].num,&local_1c,false);
      if (!bVar2) {
        local_9c = 1;
        goto LAB_0019c29e;
      }
      local_c8 = this->UnitSize * 2;
      formatString<unsigned_long,int>
                ((wchar_t *)local_c0,(unsigned_long *)L"0x%0*X,",(int *)&local_c8);
      std::__cxx11::wstring::operator+=(local_40,local_c0);
      std::__cxx11::wstring::~wstring(local_c0);
    }
    Data = Data + 1;
  } while( true );
}

Assistant:

void CDirectiveData::writeTempData(TempData& tempData)
{
	int num;

	std::wstring result;
	switch (UnitSize)
	{
	case 1:
		result = L".byte ";
		break;
	case 2:
		result = L".halfword ";
		break;
	case 4:
		result = L".word ";
		break;
	}

	for (size_t i = 0; i < TotalAmount; i++)
	{
		if (Entries[i].String == true)
		{
			unsigned char* Data = StrData.GetEntry(Entries[i].num);
			size_t len = StrData.GetLen(Entries[i].num);
			for (size_t i = 0; i < len; i++)
			{
				result += formatString(L"0x%0*X,",UnitSize*2,Data[i]);
			}
		} else {
			if (evalExpression(ExpData[Entries[i].num],num) == false)
				return;
			result += formatString(L"0x%0*X,",UnitSize*2,num);
		}
	}

	result.pop_back();
	tempData.writeLine(RamPos,result);
}